

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

FieldDescriptor * google::protobuf::compiler::java::MapValueField(FieldDescriptor *descriptor)

{
  char *failure_msg;
  Descriptor *this;
  FieldDescriptor *pFVar1;
  int line;
  Type local_1c;
  LogMessageFatal local_18;
  
  local_18.super_LogMessage.errno_saver_.saved_errno_ = 0xb;
  local_1c = (Type)descriptor->type_;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::Type,google::protobuf::internal::FieldDescriptorLite::Type>
                          ((Type *)&local_18,&local_1c,
                           "FieldDescriptor::TYPE_MESSAGE == descriptor->type()");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    this = FieldDescriptor::message_type(descriptor);
    if ((this->options_->field_0)._impl_.map_entry_ != false) {
      pFVar1 = Descriptor::map_value(this);
      return pFVar1;
    }
    failure_msg = "message->options().map_entry()";
    line = 0x399;
  }
  else {
    line = 0x397;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/helpers.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_18);
}

Assistant:

const FieldDescriptor* MapValueField(const FieldDescriptor* descriptor) {
  ABSL_CHECK_EQ(FieldDescriptor::TYPE_MESSAGE, descriptor->type());
  const Descriptor* message = descriptor->message_type();
  ABSL_CHECK(message->options().map_entry());
  return message->map_value();
}